

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver_exit_example.cpp
# Opt level: O0

void foo2(int *a)

{
  ostream *poVar1;
  runtime_error *this;
  undefined1 local_28 [8];
  saver_exit<int_&> SAVER_EXIT_1;
  int *a_local;
  
  SAVER_EXIT_1.super_state_saver<int_&,_nstd::detail::on_exit_policy>._16_8_ = a;
  nstd::saver_exit<int_&>::state_saver((saver_exit<int_&> *)local_28,a);
  *(undefined4 *)SAVER_EXIT_1.super_state_saver<int_&,_nstd::detail::on_exit_policy>._16_8_ = 2;
  poVar1 = std::operator<<((ostream *)&std::cout,"foo2 a = ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,*(int *)SAVER_EXIT_1.
                                     super_state_saver<int_&,_nstd::detail::on_exit_policy>._16_8_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"error");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void foo2(int& a) {
  SAVER_EXIT(a); // State saver on exit.

  a = 2;
  std::cout << "foo2 a = " << a << std::endl;
  throw std::runtime_error{"error"};
  // Original state will automatically restored, on error.
}